

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

int vrna_params_load_from_string(char *string,char *name,uint options)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  void *p;
  char **file_content;
  long lVar4;
  long lVar5;
  char **ppcVar6;
  char *rest;
  char *local_38;
  
  if (string == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    pcVar2 = strdup(string);
    pcVar3 = strtok_r(pcVar2,"\n",&local_38);
    if (pcVar3 == (char *)0x0) {
      p = (void *)0x0;
      lVar4 = 0;
    }
    else {
      lVar5 = 0;
      lVar4 = 0;
      p = (void *)0x0;
      do {
        if (lVar4 == lVar5) {
          lVar5 = lVar5 + 0x8000;
          p = vrna_realloc(p,(int)lVar5 * 8);
        }
        pcVar3 = strdup(pcVar3);
        *(char **)((long)p + lVar4 * 8) = pcVar3;
        lVar4 = lVar4 + 1;
        pcVar3 = strtok_r((char *)0x0,"\n",&local_38);
      } while (pcVar3 != (char *)0x0);
    }
    file_content = (char **)vrna_realloc(p,(int)lVar4 * 8 + 8);
    file_content[lVar4] = (char *)0x0;
    iVar1 = set_parameters_from_string(file_content,name);
    free(pcVar2);
    pcVar2 = *file_content;
    ppcVar6 = file_content;
    while (pcVar2 != (char *)0x0) {
      ppcVar6 = ppcVar6 + 1;
      free(pcVar2);
      pcVar2 = *ppcVar6;
    }
    free(file_content);
  }
  return iVar1;
}

Assistant:

PUBLIC int
vrna_params_load_from_string(const char   *string,
                             const char   *name,
                             unsigned int options)
{
  int ret = 0;

  if (string) {
    char    **params_array, **ptr, *tmp_string, *token, *rest;
    size_t  lines, lines_mem;

    lines         = lines_mem = 0;
    params_array  = NULL;

    /* convert string into array of lines */
    tmp_string = strdup(string);

    token = strtok_r(tmp_string, "\n", &rest);

    while (token != NULL) {
      if (lines == lines_mem) {
        lines_mem     += 32768;
        params_array  = (char **)vrna_realloc(params_array, sizeof(char *) * lines_mem);
      }

      params_array[lines++] = strdup(token);

      token = strtok_r(NULL, "\n", &rest);
    }

    /* reallocate to actual requirements */
    params_array        = (char **)vrna_realloc(params_array, sizeof(char *) * (lines + 1));
    params_array[lines] = NULL;

    /* actually apply parameters */
    ret = set_parameters_from_string(params_array,
                                     name);

    /* cleanup memory */
    free(tmp_string);

    for (ptr = params_array; *ptr != NULL; ptr++)
      free(*ptr);

    free(params_array);
  }

  return ret;
}